

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O2

_Bool X86_lockrep(MCInst *MI,SStream *O)

{
  uint8_t uVar1;
  ushort uVar2;
  unsigned_short uVar3;
  uint uVar4;
  uint uVar5;
  _Bool _Var6;
  char *fmt;
  
  uVar1 = MI->x86_prefix[0];
  _Var6 = false;
  if (uVar1 == 0xf0) {
    fmt = "lock|";
    _Var6 = false;
    goto switchD_001a2112_caseD_60;
  }
  if (uVar1 == 0xf3) {
    uVar4 = MCInst_getOpcode(MI);
    uVar3 = insn_find(insns,0x1735,uVar4,&MI->csh->insn_cache);
    if (uVar3 == 0) goto switchD_001a216b_caseD_1d1;
    uVar2 = insns[uVar3].mapid;
    fmt = "rep|";
    _Var6 = false;
    switch(uVar2) {
    case 0x1cf:
    case 0x1d3:
    case 0x1d5:
      goto switchD_001a2112_caseD_60;
    case 0x1d0:
      goto switchD_001a216b_caseD_1d0;
    case 0x1d1:
    case 0x1d2:
    case 0x1d4:
      goto switchD_001a216b_caseD_1d1;
    default:
      if (((((uVar2 - 0xd9 < 5) && ((0x19U >> (uVar2 - 0xd9 & 0x1f) & 1) != 0)) ||
           (uVar2 - 0x1ea < 3)) || ((uVar2 - 0x14a < 2 || (uVar2 - 0x29d < 2)))) || (uVar2 == 0x148)
         ) goto switchD_001a2112_caseD_60;
      if (uVar2 == 0x149) {
        if (uVar4 != 0x517) goto switchD_001a216b_caseD_1d1;
      }
      else {
        if (uVar2 == 0x29b) goto switchD_001a2112_caseD_60;
        if ((uVar2 != 0x29c) || (uVar4 != 0xab1)) goto switchD_001a216b_caseD_1d1;
      }
      goto LAB_001a221a;
    }
  }
  if (uVar1 != 0xf2) goto LAB_001a2252;
  uVar4 = MCInst_getOpcode(MI);
  uVar3 = insn_find(insns,0x1735,uVar4,&MI->csh->insn_cache);
  if (uVar3 == 0) goto switchD_001a2112_caseD_63;
  uVar2 = insns[uVar3].mapid;
  fmt = "repne|";
  uVar5 = uVar2 - 0x266;
  if (uVar5 < 0x39) {
    _Var6 = false;
    if ((0x1e000000000000dU >> ((ulong)uVar5 & 0x3f) & 1) != 0) goto switchD_001a2112_caseD_60;
    if ((ulong)uVar5 == 1) {
      if (uVar4 == 0x9f2) goto LAB_001a221a;
      goto switchD_001a2112_caseD_63;
    }
  }
  _Var6 = false;
  switch(uVar2) {
  case 0x60:
  case 0x62:
  case 100:
    break;
  case 0x61:
    if (uVar4 == 0x233) goto LAB_001a221a;
  case 99:
switchD_001a2112_caseD_63:
    MI->x86_prefix[0] = '\0';
    if (uVar4 != 0x6e9) {
LAB_001a228a:
      _Var6 = false;
      goto LAB_001a2252;
    }
    fmt = "mulsd\t";
    uVar4 = 0x6ee;
LAB_001a223a:
    MCInst_setOpcode(MI,uVar4);
    _Var6 = true;
    break;
  default:
    if ((6 < uVar2 - 0x1cf) || ((0x53U >> (uVar2 - 0x1cf & 0x1f) & 1) == 0))
    goto switchD_001a2112_caseD_63;
  }
switchD_001a2112_caseD_60:
  SStream_concat(O,fmt);
LAB_001a2252:
  if (MI->csh->detail != CS_OPT_OFF) {
    *(undefined4 *)(MI->flat_insn->detail->field_6).x86.prefix = *(undefined4 *)MI->x86_prefix;
  }
  return _Var6;
switchD_001a216b_caseD_1d0:
  if (uVar4 == 0x6ae) goto LAB_001a221a;
switchD_001a216b_caseD_1d1:
  uVar3 = insn_find(insns,0x1735,uVar4,&MI->csh->insn_cache);
  if (uVar3 != 0) {
    uVar2 = insns[uVar3].mapid;
    fmt = "repe|";
    _Var6 = false;
    switch(uVar2) {
    case 0x60:
    case 0x62:
    case 100:
      break;
    case 0x61:
      if (uVar4 != 0x233) goto switchD_001a220f_caseD_63;
LAB_001a221a:
      _Var6 = false;
      break;
    case 99:
      goto switchD_001a220f_caseD_63;
    default:
      if ((1 < uVar2 - 0x268) && (uVar2 != 0x266)) {
        if ((uVar2 == 0x267) && (uVar4 == 0x9f2)) goto LAB_001a221a;
        goto switchD_001a220f_caseD_63;
      }
    }
    goto switchD_001a2112_caseD_60;
  }
switchD_001a220f_caseD_63:
  MI->x86_prefix[0] = '\0';
  if (uVar4 != 0x6e9) goto LAB_001a228a;
  fmt = "mulss\t";
  uVar4 = 0x6f2;
  goto LAB_001a223a;
}

Assistant:

bool X86_lockrep(MCInst *MI, SStream *O)
{
	unsigned int opcode;
	bool res = false;

	switch(MI->x86_prefix[0]) {
		default:
			break;
		case 0xf0:
#ifndef CAPSTONE_DIET
			SStream_concat(O, "lock|");
#endif
			break;
		case 0xf2:	// repne
			opcode = MCInst_getOpcode(MI);
#ifndef CAPSTONE_DIET	// only care about memonic in standard (non-diet) mode
			if (valid_repne(MI->csh, opcode)) {
				SStream_concat(O, "repne|");
			} else {
				// invalid prefix
				MI->x86_prefix[0] = 0;

				// handle special cases
#ifndef CAPSTONE_X86_REDUCE
				if (opcode == X86_MULPDrr) {
					MCInst_setOpcode(MI, X86_MULSDrr);
					SStream_concat(O, "mulsd\t");
					res = true;
				}
#endif
			}
#else	// diet mode -> only patch opcode in special cases
			if (!valid_repne(MI->csh, opcode)) {
				MI->x86_prefix[0] = 0;
			}
#ifndef CAPSTONE_X86_REDUCE
			// handle special cases
			if (opcode == X86_MULPDrr) {
				MCInst_setOpcode(MI, X86_MULSDrr);
			}
#endif
#endif
			break;

		case 0xf3:
			opcode = MCInst_getOpcode(MI);
#ifndef CAPSTONE_DIET	// only care about memonic in standard (non-diet) mode
			if (valid_rep(MI->csh, opcode)) {
				SStream_concat(O, "rep|");
			} else if (valid_repe(MI->csh, opcode)) {
				SStream_concat(O, "repe|");
			} else {
				// invalid prefix
				MI->x86_prefix[0] = 0;

				// handle special cases
#ifndef CAPSTONE_X86_REDUCE
				if (opcode == X86_MULPDrr) {
					MCInst_setOpcode(MI, X86_MULSSrr);
					SStream_concat(O, "mulss\t");
					res = true;
				}
#endif
			}
#else	// diet mode -> only patch opcode in special cases
			if (!valid_rep(MI->csh, opcode) && !valid_repe(MI->csh, opcode)) {
				MI->x86_prefix[0] = 0;
			}
#ifndef CAPSTONE_X86_REDUCE
			// handle special cases
			if (opcode == X86_MULPDrr) {
				MCInst_setOpcode(MI, X86_MULSSrr);
			}
#endif
#endif
			break;
	}

	// copy normalized prefix[] back to x86.prefix[]
	if (MI->csh->detail)
		memcpy(MI->flat_insn->detail->x86.prefix, MI->x86_prefix, ARR_SIZE(MI->x86_prefix));

	return res;
}